

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

bool Catch::matchesFilters
               (vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_> *filters,
               TestCase *testCase)

{
  TestCaseFilters *pTVar1;
  TestCaseFilters *pTVar2;
  bool bVar3;
  TestCaseFilters *this;
  
  pTVar1 = (filters->
           super__Vector_base<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  pTVar2 = (filters->
           super__Vector_base<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>).
           _M_impl.super__Vector_impl_data._M_start;
  do {
    this = pTVar2;
    if (this == pTVar1) break;
    bVar3 = TestCaseFilters::shouldInclude(this,testCase);
    pTVar2 = this + 1;
  } while (bVar3);
  return this == pTVar1;
}

Assistant:

inline bool matchesFilters( std::vector<TestCaseFilters> const& filters, TestCase const& testCase ) {
        std::vector<TestCaseFilters>::const_iterator it = filters.begin();
        std::vector<TestCaseFilters>::const_iterator itEnd = filters.end();
        for(; it != itEnd; ++it )
            if( !it->shouldInclude( testCase ) )
                return false;
        return true;
    }